

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

int addDeviceOrModuleToLinkedListAsDevice
              (IOTHUB_DEVICE_OR_MODULE *iothubDeviceOrModule,
              SINGLYLINKEDLIST_HANDLE deviceOrModuleList)

{
  IOTHUB_DEVICE *device_00;
  LOGGER_LOG p_Var1;
  LIST_ITEM_HANDLE pLVar2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_DEVICE *device;
  int result;
  SINGLYLINKEDLIST_HANDLE deviceOrModuleList_local;
  IOTHUB_DEVICE_OR_MODULE *iothubDeviceOrModule_local;
  
  device_00 = (IOTHUB_DEVICE *)malloc(0x88);
  if (device_00 == (IOTHUB_DEVICE *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"addDeviceOrModuleToLinkedListAsDevice",0x303,1,"Malloc failed for device");
    }
    device._4_4_ = 2;
  }
  else {
    move_deviceOrModule_members_to_device(iothubDeviceOrModule,device_00);
    pLVar2 = singlylinkedlist_add(deviceOrModuleList,device_00);
    if (pLVar2 == (LIST_ITEM_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"addDeviceOrModuleToLinkedListAsDevice",0x30d,1,"singlylinkedlist_add failed");
      }
      free(device_00);
      device._4_4_ = 3;
    }
    else {
      device._4_4_ = 0;
    }
  }
  return device._4_4_;
}

Assistant:

static int addDeviceOrModuleToLinkedListAsDevice(IOTHUB_DEVICE_OR_MODULE* iothubDeviceOrModule, SINGLYLINKEDLIST_HANDLE deviceOrModuleList)
{
    int result;
    IOTHUB_DEVICE* device = NULL;

    if ((device = (IOTHUB_DEVICE*)malloc(sizeof(IOTHUB_DEVICE))) == NULL)
    {
        LogError("Malloc failed for device");
        result = IOTHUB_REGISTRYMANAGER_ERROR;
    }
    else
    {
        //Convert to a Device struct
        move_deviceOrModule_members_to_device(iothubDeviceOrModule, device);

        if ((singlylinkedlist_add(deviceOrModuleList, device)) == NULL)
        {
            LogError("singlylinkedlist_add failed");
            free(device);   //only free structure. Because members are still referenced by iothubDeviceOrModule we will free them after
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else
        {
            result = IOTHUB_REGISTRYMANAGER_OK;
        }
    }

    return result;
}